

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JSONStringifier.cpp
# Opt level: O1

void __thiscall
Js::JSONStringifier::ReadProxy
          (JSONStringifier *this,JavascriptProxy *proxyObject,JSONObject *jsonObject,
          JSONObjectStack *stack)

{
  code *pcVar1;
  JSONStringifier *pJVar2;
  bool bVar3;
  BOOL BVar4;
  undefined4 *puVar5;
  Var aValue;
  JavascriptString *propertyName;
  Type TVar6;
  undefined1 local_98 [8];
  PropertyDescriptor propertyDescriptor;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord;
  JSONStringifier *local_40;
  Type local_34;
  
  TVar6 = 0;
  propertyRecord = (PropertyRecord *)proxyObject;
  local_40 = this;
  propertyDescriptor._40_8_ =
       JavascriptProxy::PropertyKeysTrap(proxyObject,GetOwnPropertyNamesKind,this->scriptContext);
  local_34 = (((JavascriptArray *)propertyDescriptor._40_8_)->super_ArrayObject).length;
  if (local_34 != 0) {
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    pJVar2 = local_40;
    do {
      aValue = (Var)(**(code **)(*(long *)propertyDescriptor._40_8_ + 0x390))
                              (propertyDescriptor._40_8_,TVar6);
      bVar3 = VarIs<Js::JavascriptString>(aValue);
      if (bVar3) {
        propertyName = UnsafeVarTo<Js::JavascriptString>(aValue);
      }
      else {
        propertyName = (JavascriptString *)0x0;
      }
      if (propertyName == (JavascriptString *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        *puVar5 = 1;
        bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JSONStringifier.cpp"
                                    ,0x216,"(propertyName)","propertyName");
        if (!bVar3) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar5 = 0;
      }
      else {
        PropertyDescriptor::PropertyDescriptor((PropertyDescriptor *)local_98);
        JavascriptConversion::ToPropertyKey
                  (propertyName,pJVar2->scriptContext,&local_50,(PropertyString **)0x0);
        BVar4 = JavascriptOperators::GetOwnPropertyDescriptor
                          ((RecyclableObject *)propertyRecord,local_50->pid,pJVar2->scriptContext,
                           (PropertyDescriptor *)local_98);
        if (BVar4 != 0) {
          bVar3 = PropertyDescriptor::IsEnumerable((PropertyDescriptor *)local_98);
          if (bVar3) {
            ReadObjectElement(local_40,propertyName,local_50,(RecyclableObject *)propertyRecord,
                              jsonObject,stack);
          }
        }
      }
      TVar6 = TVar6 + 1;
    } while (local_34 != TVar6);
  }
  return;
}

Assistant:

void
JSONStringifier::ReadProxy(_In_ JavascriptProxy* proxyObject, _In_ JSONObject* jsonObject, _In_ JSONObjectStack* stack)
{
    JavascriptArray* ownPropertyNames = proxyObject->PropertyKeysTrap(JavascriptProxy::KeysTrapKind::GetOwnPropertyNamesKind, this->scriptContext);

    // filter enumerable keys
    uint32 resultLength = ownPropertyNames->GetLength();
    for (uint32 i = 0; i < resultLength; i++)
    {
        Var element = ownPropertyNames->DirectGetItem(i);

        // Array should only have string elements, but let's check to be safe
        JavascriptString* propertyName = JavascriptOperators::TryFromVar<JavascriptString>(element);
        Assert(propertyName);
        if (propertyName != nullptr)
        {
            PropertyDescriptor propertyDescriptor;
            PropertyRecord const* propertyRecord;
            JavascriptConversion::ToPropertyKey(propertyName, scriptContext, &propertyRecord, nullptr);
            if (JavascriptOperators::GetOwnPropertyDescriptor(proxyObject, propertyRecord->GetPropertyId(), scriptContext, &propertyDescriptor))
            {
                if (propertyDescriptor.IsEnumerable())
                {
                    this->ReadObjectElement(propertyName, propertyRecord, proxyObject, jsonObject, stack);
                }
            }
        }
    }
}